

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O2

Maj3_Man_t * Maj3_ManAlloc(int nVars,int nNodes,Vec_Int_t *vLevels)

{
  int iVar1;
  Maj3_Man_t *p;
  Vec_Wrd_t *pVVar2;
  bmcg_sat_solver *s;
  
  p = (Maj3_Man_t *)calloc(1,0x11c0);
  p->vLevels = vLevels;
  p->nVars = nVars;
  p->nNodes = nNodes;
  p->nObjs = nNodes + nVars;
  iVar1 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    iVar1 = 1;
  }
  p->nWords = iVar1;
  iVar1 = Maj3_ManMarkup(p);
  p->iVar = iVar1;
  pVVar2 = Maj3_ManTruthTables(p);
  p->vInfo = pVVar2;
  s = bmcg_sat_solver_start();
  p->pSat = s;
  bmcg_sat_solver_set_nvars(s,p->iVar);
  Maj3_ManAddCnfStart(p);
  return p;
}

Assistant:

Maj3_Man_t * Maj3_ManAlloc( int nVars, int nNodes, Vec_Int_t * vLevels )
{
    Maj3_Man_t * p = ABC_CALLOC( Maj3_Man_t, 1 );
    p->vLevels    = vLevels;
    p->nVars      = nVars;
    p->nNodes     = nNodes;
    p->nObjs      = nVars + nNodes;
    p->nWords     = Abc_TtWordNum(nVars);
    p->iVar       = Maj3_ManMarkup( p );
    p->vInfo      = Maj3_ManTruthTables( p );
    p->pSat       = bmcg_sat_solver_start();
    bmcg_sat_solver_set_nvars( p->pSat, p->iVar );
    Maj3_ManAddCnfStart( p );
    return p;
}